

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PP_FDTD_1D.cpp
# Opt level: O0

bool __thiscall PP_FDTD_1D::run(PP_FDTD_1D *this,bool shortCircuit,bool borderExcitationON)

{
  ulong local_38;
  unsigned_long k_2;
  unsigned_long k_1;
  unsigned_long k;
  unsigned_long n;
  bool borderExcitationON_local;
  bool shortCircuit_local;
  PP_FDTD_1D *this_local;
  
  calculateCoefficients(this);
  (*this->_vptr_PP_FDTD_1D[2])();
  for (k = 1; k < this->Nt; k = k + 1) {
    for (k_1 = 1; k_1 < this->Nz; k_1 = k_1 + 1) {
      this->I[k][k_1] =
           this->c1 * (this->V[k - 1][k_1] - this->V[k - 1][k_1 - 1]) +
           this->c2 * this->I[k - 1][k_1];
    }
    if (shortCircuit) {
      *this->I[k] = this->I[k][1];
    }
    else {
      *this->I[k] = 0.0;
    }
    if (borderExcitationON) {
      (*this->_vptr_PP_FDTD_1D[3])(this,k);
      for (k_2 = 1; k_2 < this->Nz - 1; k_2 = k_2 + 1) {
        this->V[k][k_2] =
             this->c3 * (this->I[k][k_2 + 1] - this->I[k][k_2]) + this->c4 * this->V[k - 1][k_2];
      }
    }
    else {
      for (local_38 = 0; local_38 < this->Nz - 1; local_38 = local_38 + 1) {
        this->V[k][local_38] =
             this->c3 * (this->I[k][local_38 + 1] - this->I[k][local_38]) +
             this->c4 * this->V[k - 1][local_38];
      }
    }
    if (shortCircuit) {
      this->V[k][this->Nz - 1] = 0.0;
    }
    else {
      this->V[k][this->Nz - 1] = this->V[k][this->Nz - 2];
    }
  }
  return true;
}

Assistant:

bool PP_FDTD_1D::run(bool shortCircuit, bool borderExcitationON)
{
    //determine the coefficient of numerical iteration equations
    calculateCoefficients();

    //at t=0 initialize the whole space
    intialState();

    //iterations
    for(unsigned long n=1 ; n<Nt ; n++) //loop over time
    {
        //determine the next current over the whole space
        for(unsigned long k=1 ; k<Nz ; k++) //loop over space : may be multithread
        {
            //I[n][k] stands for i(k*dz, (n+0.5)*dt)
            //V[n][k] stands for v((k+0.5)*dz, n*dt)
            I[n][k] = c1*(V[n-1][k]-V[n-1][k-1]) + c2*I[n-1][k];

        }
        //border conditions for current: on the left because it is the state that cannot be calculated (correct me if I am wrong)
        if(shortCircuit)
        {
            I[n][0] = I[n][1];
        }
        else
        {
            I[n][0] = 0.0;
        }

        //deternmine the next voltage state
        if(borderExcitationON) //if we apply an excitation (input voltage)
        {
            borderExcitation(n);
            for(unsigned long k=1 ; k<(Nz-1) ; k++)
            {
                V[n][k] = c3*(I[n][k+1]-I[n][k]) + c4*V[n-1][k];
            }
        }
        else
        {
            for(unsigned long k=0 ; k<(Nz-1) ; k++)
            {
                V[n][k] = c3*(I[n][k+1]-I[n][k]) + c4*V[n-1][k];
            }
        }
        //boundary conditions on voltage: either 0 to simulate a short circuit or a miror condition for an open circuit
        if(shortCircuit)
        {
            V[n][Nz-1] = 0.0;
        }
        else
        {
            V[n][Nz-1] = V[n][Nz-2];
        }

    }

    return true;
}